

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chromecast.h
# Opt level: O2

bool cc::loadMedia(Connection *conn,string *video,double position)

{
  int __val;
  bool bVar1;
  allocator<char> local_139;
  double local_138;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30;
  
  local_138 = position;
  if (video->_M_string_length == 0) {
    puts("Can\'t load empty video");
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"urn:x-cast:com.google.cast.media",&local_139);
    __val = s_requestId;
    s_requestId = s_requestId + 1;
    std::__cxx11::to_string(&local_110,__val);
    std::operator+(&local_f0,"{  \"type\": \"LOAD\",  \"requestId\": ",&local_110);
    std::operator+(&local_d0,&local_f0,",  \"media\": {   \"contentId\": \"");
    std::operator+(&local_b0,&local_d0,video);
    std::operator+(&local_90,&local_b0,
                   "\",    \"streamType\": \"BUFFERED\",    \"contentType\": \"x-youtube/video\"  },  \"currentTime\": "
                  );
    std::__cxx11::to_string(&local_130,local_138);
    std::operator+(&local_70,&local_90,&local_130);
    std::operator+(&local_50,&local_70,"}");
    bVar1 = sendMessage(conn,&local_30,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_30);
  }
  return bVar1;
}

Assistant:

bool loadMedia(const Connection &conn, const std::string &video, double position)
{
    if (video.empty()) {
        puts("Can't load empty video");
        return false;
    }
    return sendMessage(conn,
            ns::strings[ns::Media],
            "{ "
            " \"type\": \"LOAD\", "
            " \"requestId\": " + std::to_string(s_requestId++) + ", "
            " \"media\": {"
            "   \"contentId\": \"" + video + "\", "
            "   \"streamType\": \"BUFFERED\", "
            "   \"contentType\": \"x-youtube/video\" "
            " }, "
            " \"currentTime\": " + std::to_string(position) +
            "}"
        );
}